

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactBvh.cpp
# Opt level: O1

int __thiscall
btBvhTree::_calc_splitting_axis
          (btBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex)

{
  int iVar1;
  btScalar *pbVar2;
  int i;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  fVar6 = 0.0;
  fVar7 = 0.0;
  fVar5 = 0.0;
  lVar3 = (long)startIndex;
  fVar8 = 0.0;
  fVar10 = 0.0;
  fVar11 = 0.0;
  if (endIndex - startIndex != 0 && startIndex <= endIndex) {
    pbVar2 = (primitive_boxes->super_btAlignedObjectArray<GIM_BVH_DATA>).m_data[lVar3].m_bound.m_max
             .m_floats + 1;
    lVar4 = endIndex - lVar3;
    do {
      fVar8 = fVar8 + (((btVector3 *)(pbVar2 + -1))->m_floats[0] + pbVar2[-5]) * 0.5;
      fVar10 = fVar10 + ((float)*(undefined8 *)(pbVar2 + -4) + (float)*(undefined8 *)pbVar2) * 0.5;
      fVar11 = fVar11 + ((float)((ulong)*(undefined8 *)(pbVar2 + -4) >> 0x20) +
                        (float)((ulong)*(undefined8 *)pbVar2 >> 0x20)) * 0.5;
      pbVar2 = pbVar2 + 9;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  fVar9 = (float)(endIndex - startIndex);
  if (startIndex < endIndex) {
    fVar12 = 1.0 / fVar9;
    pbVar2 = (primitive_boxes->super_btAlignedObjectArray<GIM_BVH_DATA>).m_data[lVar3].m_bound.m_max
             .m_floats + 1;
    lVar3 = endIndex - lVar3;
    fVar6 = 0.0;
    fVar7 = 0.0;
    fVar5 = 0.0;
    do {
      fVar13 = (((btVector3 *)(pbVar2 + -1))->m_floats[0] + pbVar2[-5]) * 0.5 - fVar8 * fVar12;
      fVar5 = fVar5 + fVar13 * fVar13;
      fVar13 = ((float)*(undefined8 *)(pbVar2 + -4) + (float)*(undefined8 *)pbVar2) * 0.5 -
               fVar12 * fVar10;
      fVar14 = ((float)((ulong)*(undefined8 *)(pbVar2 + -4) >> 0x20) +
               (float)((ulong)*(undefined8 *)pbVar2 >> 0x20)) * 0.5 - fVar12 * fVar11;
      fVar6 = fVar6 + fVar13 * fVar13;
      fVar7 = fVar7 + fVar14 * fVar14;
      pbVar2 = pbVar2 + 9;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  fVar8 = 1.0 / (fVar9 + -1.0);
  iVar1 = (uint)(fVar5 * fVar8 < fVar8 * fVar7) * 2;
  if (fVar5 * fVar8 < fVar8 * fVar6) {
    iVar1 = (fVar8 * fVar6 < fVar8 * fVar7) + 1;
  }
  return iVar1;
}

Assistant:

int btBvhTree::_calc_splitting_axis(
	GIM_BVH_DATA_ARRAY & primitive_boxes, int startIndex,  int endIndex)
{

	int i;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	btVector3 variance(btScalar(0.),btScalar(0.),btScalar(0.));
	int numIndices = endIndex-startIndex;

	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);

	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		btVector3 diff2 = center-means;
		diff2 = diff2 * diff2;
		variance += diff2;
	}
	variance *= (btScalar(1.)/	((btScalar)numIndices-1)	);

	return variance.maxAxis();
}